

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::HandleRlyRx(CommissionerImpl *this,Request *aRlyRx)

{
  bool bVar1;
  int iVar2;
  Error *pEVar3;
  mapped_type *pmVar4;
  shared_ptr<ot::commissioner::tlv::Tlv> *psVar5;
  element_type *peVar6;
  ByteArray *pBVar7;
  byte *pbVar8;
  ulong uVar9;
  Endpoint *pEVar10;
  commissioner *this_00;
  TimePoint *pTVar11;
  pointer ppVar12;
  ByteArray *aBytes;
  ByteArray *aBytes_00;
  ByteArray *aBytes_01;
  ByteArray *aBytes_02;
  TimePoint *aTimePoint;
  v10 *pvVar13;
  unsigned_long *in_R8;
  unsigned_short *__args_3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>,_bool>
  pVar15;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  bool local_f79;
  string local_e90;
  anon_class_1_0_00000001 local_e6a;
  v10 local_e69;
  v10 *local_e68;
  char *local_e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e58;
  allocator local_e31;
  string local_e30;
  ErrorCode local_e0c;
  JoinerSession *local_e08;
  JoinerSession *session;
  undefined1 local_df5;
  int local_df4;
  bool condition;
  TimePoint TStack_df0;
  string local_de8;
  anon_class_1_0_00000001 local_dc2;
  v10 local_dc1;
  v10 *local_dc0;
  char *local_db8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  allocator local_d89;
  string local_d88;
  undefined1 local_d62 [2];
  string local_d60;
  anon_class_1_0_00000001 local_d3a;
  v10 local_d39;
  v10 *local_d38;
  char *local_d30;
  string local_d28;
  allocator local_d01;
  string local_d00;
  Address local_ce0;
  undefined1 local_cc8 [8];
  string peerAddr;
  JoinerSession *session_1;
  unsigned_short local_c8a;
  Address local_c88;
  tuple<ot::commissioner::CommissionerImpl_&,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_unsigned_short_&,_ot::commissioner::Address_&&,_unsigned_short_&&,_ot::commissioner::Address_&,_const_unsigned_short_&>
  local_c70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c28;
  ErrorCode local_c0c;
  Error local_c08;
  string local_be0;
  anon_class_1_0_00000001 local_bba;
  v10 local_bb9;
  v10 *local_bb8;
  char *local_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  Error local_b88;
  string local_b60;
  anon_class_1_0_00000001 local_b3a;
  v10 local_b39;
  v10 *local_b38;
  char *local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  allocator local_b01;
  string local_b00;
  string local_ae0 [32];
  undefined1 local_ac0 [8];
  Address localAddr;
  _Self local_a88;
  _Self local_a80;
  iterator it;
  string local_a70;
  anon_class_1_0_00000001 local_a4a;
  v10 local_a49;
  v10 *local_a48;
  char *local_a40;
  string local_a38;
  allocator local_a11;
  string local_a10;
  anon_class_1_0_00000001 local_9ea;
  v10 local_9e9;
  v10 *local_9e8;
  size_t local_9e0;
  string local_9d8;
  Error local_9b8;
  key_type local_98c [2];
  anon_class_1_0_00000001 local_98a;
  v10 local_989;
  v10 *local_988;
  size_t local_980;
  string local_978;
  Error local_958;
  key_type local_92c [2];
  anon_class_1_0_00000001 local_92a;
  v10 local_929;
  v10 *local_928;
  size_t local_920;
  string local_918;
  Error local_8f8;
  key_type local_8cc [2];
  anon_class_1_0_00000001 local_8ca;
  v10 local_8c9;
  v10 *local_8c8;
  size_t local_8c0;
  string local_8b8;
  Error local_898;
  key_type local_869;
  ErrorCode local_868 [4];
  Error local_858;
  undefined1 local_830 [8];
  ByteArray dtlsRecords;
  ByteArray joinerId;
  ByteArray joinerIid;
  undefined1 local_7e0 [4];
  uint16_t joinerRouterLocator;
  uint16_t joinerUdpPort;
  string joinerPSKd;
  TlvPtr tlv;
  TlvSet tlvSet;
  Error error;
  Request *aRlyRx_local;
  CommissionerImpl *this_local;
  undefined1 local_730 [16];
  v10 *local_720;
  ulong local_718;
  v10 *local_710;
  size_t sStack_708;
  string *local_700;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_6f8 [3];
  undefined1 local_6e0 [16];
  v10 *local_6d0;
  ulong local_6c8;
  v10 *local_6c0;
  size_t sStack_6b8;
  string *local_6b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_6a8 [3];
  undefined1 local_690 [16];
  v10 *local_680;
  ulong local_678;
  v10 *local_670;
  size_t sStack_668;
  string *local_660;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_658 [3];
  undefined1 local_640 [16];
  v10 *local_630;
  ulong local_628;
  v10 *local_620;
  size_t sStack_618;
  string *local_610;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_608 [2];
  undefined1 local_5f8 [16];
  v10 *local_5e8;
  char *local_5e0;
  string *local_5d8;
  v10 *local_5d0;
  char *pcStack_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_5b8 [2];
  undefined1 local_5a8 [16];
  v10 *local_598;
  char *local_590;
  string *local_588;
  v10 *local_580;
  char *pcStack_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_570;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_568 [2];
  undefined1 local_558 [16];
  v10 *local_548;
  char *local_540;
  string *local_538;
  v10 *local_530;
  char *pcStack_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_520;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_518 [2];
  undefined1 local_508 [16];
  v10 *local_4f8;
  char *local_4f0;
  string *local_4e8;
  v10 *local_4e0;
  char *pcStack_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d0;
  v10 *local_4c8;
  v10 **local_4c0;
  v10 *local_4b8;
  v10 **local_4b0;
  v10 *local_4a8;
  v10 **local_4a0;
  v10 *local_498;
  v10 **local_490;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_unsigned_long>
  local_488;
  undefined1 local_458 [16];
  v10 *local_448;
  char *local_440;
  iterator *local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_430;
  string *local_428;
  v10 *local_420;
  char *pcStack_418;
  string *local_410;
  v10 *local_408;
  v10 **local_400;
  v10 *local_3f8;
  v10 **local_3f0;
  v10 *local_3e8;
  v10 **local_3e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  local_3d8;
  undefined1 local_3a0 [16];
  v10 *local_390;
  char *local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  v10 *local_370;
  v10 *local_368;
  char *pcStack_360;
  string *local_358;
  v10 *local_350;
  v10 **local_348;
  v10 *local_340;
  v10 **local_338;
  v10 *local_330;
  v10 **local_328;
  v10 **local_320;
  v10 *local_318;
  size_t sStack_310;
  v10 **local_300;
  v10 *local_2f8;
  size_t sStack_2f0;
  v10 **local_2e0;
  v10 *local_2d8;
  size_t sStack_2d0;
  v10 **local_2c0;
  v10 *local_2b8;
  size_t sStack_2b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2a0;
  undefined1 *local_298;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_290;
  undefined8 local_288;
  undefined1 *local_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_278;
  undefined1 *local_270;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_268;
  undefined8 local_260;
  undefined1 *local_258;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_250;
  undefined1 *local_248;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_240;
  undefined8 local_238;
  undefined1 *local_230;
  CommissionerImpl **local_228;
  undefined1 *local_220;
  CommissionerImpl **local_218;
  undefined8 local_210;
  undefined1 *local_208;
  CommissionerImpl **local_200;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1e0;
  undefined1 *local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1d0;
  undefined8 local_1c8;
  undefined1 *local_1c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1b8;
  undefined1 *local_1b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1a8;
  undefined8 local_1a0;
  undefined1 *local_198;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_190;
  undefined1 *local_188;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_180;
  undefined8 local_178;
  undefined1 *local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_168;
  undefined1 *local_160;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_158;
  undefined8 local_150;
  undefined1 *local_148;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_138;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_128;
  v10 **local_120;
  v10 *local_118;
  char *pcStack_110;
  v10 **local_100;
  v10 *local_f8;
  char *pcStack_f0;
  v10 **local_e0;
  v10 *local_d8;
  char *pcStack_d0;
  v10 **local_c0;
  v10 *local_b8;
  char *pcStack_b0;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_unsigned_long>
  *local_80;
  undefined1 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_unsigned_long>
  *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_unsigned_long>
  *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  Error::Error((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
         *)&tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount);
  std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
            ((shared_ptr<ot::commissioner::tlv::Tlv> *)((long)&joinerPSKd.field_2 + 8));
  std::__cxx11::string::string((string *)local_7e0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &dtlsRecords.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_830);
  GetTlvSet(&local_858,
            (TlvSet *)
            &tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount,aRlyRx,kMeshCoP);
  pEVar3 = Error::operator=((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            &local_858);
  local_868[0] = kNone;
  bVar1 = commissioner::operator!=(pEVar3,local_868);
  Error::~Error(&local_858);
  if (!bVar1) {
    local_869 = kJoinerUdpPort;
    pmVar4 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&tlv.
                              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,&local_869);
    psVar5 = std::shared_ptr<ot::commissioner::tlv::Tlv>::operator=
                       ((shared_ptr<ot::commissioner::tlv::Tlv> *)((long)&joinerPSKd.field_2 + 8),
                        pmVar4);
    bVar1 = std::operator!=(psVar5,(nullptr_t)0x0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      peVar6 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(joinerPSKd.field_2._M_local_buf + 8));
      joinerIid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_2_ =
           commissioner::tlv::Tlv::GetValueAsUint16(peVar6);
      local_8cc[0] = kJoinerRouterLocator;
      pmVar4 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&tlv.
                                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,local_8cc);
      psVar5 = std::shared_ptr<ot::commissioner::tlv::Tlv>::operator=
                         ((shared_ptr<ot::commissioner::tlv::Tlv> *)((long)&joinerPSKd.field_2 + 8),
                          pmVar4);
      bVar1 = std::operator!=(psVar5,(nullptr_t)0x0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        peVar6 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(joinerPSKd.field_2._M_local_buf + 8));
        joinerIid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_2_ =
             commissioner::tlv::Tlv::GetValueAsUint16(peVar6);
        local_92c[0] = kJoinerIID;
        pmVar4 = std::
                 map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                 ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                               *)&tlv.
                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,local_92c);
        psVar5 = std::shared_ptr<ot::commissioner::tlv::Tlv>::operator=
                           ((shared_ptr<ot::commissioner::tlv::Tlv> *)
                            ((long)&joinerPSKd.field_2 + 8),pmVar4);
        bVar1 = std::operator!=(psVar5,(nullptr_t)0x0);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          peVar6 = std::
                   __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(joinerPSKd.field_2._M_local_buf + 8));
          pBVar7 = commissioner::tlv::Tlv::GetValue(peVar6);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,pBVar7);
          local_98c[0] = kJoinerDtlsEncapsulation;
          pmVar4 = std::
                   map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                   ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                                 *)&tlv.
                                    super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,local_98c);
          psVar5 = std::shared_ptr<ot::commissioner::tlv::Tlv>::operator=
                             ((shared_ptr<ot::commissioner::tlv::Tlv> *)
                              ((long)&joinerPSKd.field_2 + 8),pmVar4);
          bVar1 = std::operator!=(psVar5,(nullptr_t)0x0);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            peVar6 = std::
                     __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(joinerPSKd.field_2._M_local_buf + 8));
            pBVar7 = commissioner::tlv::Tlv::GetValue(peVar6);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_830,pBVar7);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &dtlsRecords.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &dtlsRecords.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,0);
            *pbVar8 = *pbVar8 ^ 2;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_a10,"joiner-session",&local_a11);
            HandleRlyRx::anon_class_1_0_00000001::operator()(&local_a4a);
            local_400 = &local_a48;
            local_408 = &local_a49;
            bVar14 = ::fmt::v10::operator()(local_408);
            local_a40 = (char *)bVar14.size_;
            local_a48 = (v10 *)bVar14.data_;
            ::fmt::v10::detail::
            check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short_&,_unsigned_long,_FMT_COMPILE_STRING,_0>
                      ();
            utils::Hex_abi_cxx11_
                      (&local_a70,
                       (utils *)&dtlsRecords.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,aBytes);
            it._M_node = (_Base_ptr)
                         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_830);
            local_410 = &local_a38;
            local_420 = local_a48;
            pcStack_418 = local_a40;
            local_428 = &local_a70;
            local_430 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&joinerIid.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
            local_438 = &it;
            local_a0 = &local_420;
            local_448 = local_a48;
            local_440 = local_a40;
            local_98 = local_448;
            pcStack_90 = local_440;
            ::fmt::v10::
            make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,unsigned_short,unsigned_long>
                      (&local_488,(v10 *)local_428,local_430,(unsigned_short *)local_438,in_R8);
            local_78 = local_458;
            local_80 = &local_488;
            local_60 = 0x42d;
            fmt_03.size_ = 0x42d;
            fmt_03.data_ = local_440;
            args_03.field_1.values_ = in_R9.values_;
            args_03.desc_ = (unsigned_long_long)local_80;
            local_70 = local_80;
            local_68 = local_80;
            local_58 = local_78;
            ::fmt::v10::vformat_abi_cxx11_(&local_a38,local_448,fmt_03,args_03);
            Log(kDebug,&local_a10,&local_a38);
            std::__cxx11::string::~string((string *)&local_a38);
            std::__cxx11::string::~string((string *)&local_a70);
            std::__cxx11::string::~string((string *)&local_a10);
            std::allocator<char>::~allocator((allocator<char> *)&local_a11);
            local_a80._M_node =
                 (_Base_ptr)
                 std::
                 map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
                 ::find(&this->mJoinerSessions,
                        (key_type *)
                        &dtlsRecords.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
            local_a88._M_node =
                 (_Base_ptr)
                 std::
                 map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
                 ::end(&this->mJoinerSessions);
            bVar1 = std::operator!=(&local_a80,&local_a88);
            local_f79 = false;
            if (bVar1) {
              ppVar12 = std::
                        _Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>
                        ::operator->(&local_a80);
              local_f79 = JoinerSession::Disabled(&ppVar12->second);
            }
            if (local_f79 != false) {
              std::
              map<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::JoinerSession,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
              ::erase_abi_cxx11_((map<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::JoinerSession,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                                  *)&this->mJoinerSessions,(iterator)local_a80._M_node);
              local_a80._M_node =
                   (_Base_ptr)
                   std::
                   map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
                   ::end(&this->mJoinerSessions);
            }
            localAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)std::
                          map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
                          ::end(&this->mJoinerSessions);
            bVar1 = std::operator==(&local_a80,
                                    (_Self *)&localAddr.mBytes.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar1) {
              Address::Address((Address *)local_ac0);
              (**this->mCommissionerHandler->_vptr_CommissionerHandler)
                        (local_ae0,this->mCommissionerHandler,
                         &dtlsRecords.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::operator=((string *)local_7e0,local_ae0);
              std::__cxx11::string::~string(local_ae0);
              uVar9 = std::__cxx11::string::empty();
              if ((uVar9 & 1) == 0) {
                coap::CoapSecure::GetLocalAddr(&local_c08,&this->mBrClient,(Address *)local_ac0);
                pEVar3 = Error::operator=((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header.
                                                    _M_node_count,&local_c08);
                local_c0c = kNone;
                bVar1 = commissioner::operator!=(pEVar3,&local_c0c);
                Error::~Error(&local_c08);
                if (bVar1) {
                  local_df4 = 4;
                }
                else {
                  std::forward_as_tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                            (&local_c28);
                  pEVar10 = coap::Message::GetEndpoint(aRlyRx);
                  (*pEVar10->_vptr_Endpoint[3])(&local_c88);
                  pEVar10 = coap::Message::GetEndpoint(aRlyRx);
                  iVar2 = (*pEVar10->_vptr_Endpoint[4])();
                  local_c8a = (unsigned_short)iVar2;
                  __args_3 = (unsigned_short *)
                             ((long)&joinerIid.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
                  in_R9.values_ =
                       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                       ((long)&joinerIid.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
                  std::
                  forward_as_tuple<ot::commissioner::CommissionerImpl&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string&,unsigned_short&,unsigned_short&,ot::commissioner::Address,unsigned_short,ot::commissioner::Address&,unsigned_short_const&>
                            (&local_c70,this,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &dtlsRecords.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_7e0,__args_3,(unsigned_short *)in_R9.values_,&local_c88,
                             &local_c8a,(Address *)local_ac0,&kListeningJoinerPort);
                  pVar15 = std::
                           map<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::JoinerSession,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                           ::
                           emplace<std::piecewise_construct_t_const&,std::tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>&>,std::tuple<ot::commissioner::CommissionerImpl&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string&,unsigned_short&,unsigned_short&,ot::commissioner::Address&&,unsigned_short&&,ot::commissioner::Address&,unsigned_short_const&>>
                                     ((map<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::JoinerSession,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                                       *)&this->mJoinerSessions,
                                      (piecewise_construct_t *)&std::piecewise_construct,
                                      (tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                                       *)&local_c28,&local_c70);
                  local_c28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)pVar15.first._M_node;
                  local_c28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = pVar15.second;
                  local_a80._M_node =
                       (_Base_ptr)
                       local_c28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  Address::~Address(&local_c88);
                  ppVar12 = std::
                            _Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>
                            ::operator->(&local_a80);
                  peerAddr.field_2._8_8_ = &ppVar12->second;
                  JoinerSession::GetPeerAddr(&local_ce0,(JoinerSession *)peerAddr.field_2._8_8_);
                  Address::ToString_abi_cxx11_((string *)local_cc8,&local_ce0);
                  Address::~Address(&local_ce0);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_d00,"joiner-session",&local_d01);
                  HandleRlyRx::anon_class_1_0_00000001::operator()(&local_d3a);
                  local_348 = &local_d38;
                  local_350 = &local_d39;
                  bVar14 = ::fmt::v10::operator()(local_350);
                  local_d30 = (char *)bVar14.size_;
                  local_d38 = (v10 *)bVar14.data_;
                  ::fmt::v10::detail::
                  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short,_FMT_COMPILE_STRING,_0>
                            ();
                  utils::Hex_abi_cxx11_
                            ((string *)(local_d62 + 2),
                             (utils *)&dtlsRecords.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,aBytes_02)
                  ;
                  local_d62 = (undefined1  [2])
                              JoinerSession::GetPeerPort((JoinerSession *)peerAddr.field_2._8_8_);
                  local_358 = &local_d28;
                  local_368 = local_d38;
                  pcStack_360 = local_d30;
                  local_370 = (v10 *)(local_d62 + 2);
                  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_cc8;
                  local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d62;
                  local_50 = &local_368;
                  local_390 = local_d38;
                  local_388 = local_d30;
                  local_48 = local_390;
                  pcStack_40 = local_388;
                  ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string,unsigned_short>
                            (&local_3d8,local_370,local_378,local_380,__args_3);
                  local_30 = local_3a0;
                  local_38 = &local_3d8;
                  local_18 = 0x2dd;
                  fmt_06.size_ = 0x2dd;
                  fmt_06.data_ = local_388;
                  args_06.field_1.values_ = in_R9.values_;
                  args_06.desc_ = (unsigned_long_long)local_38;
                  local_28 = local_38;
                  local_20 = local_38;
                  local_10 = local_30;
                  ::fmt::v10::vformat_abi_cxx11_(&local_d28,local_390,fmt_06,args_06);
                  Log(kDebug,&local_d00,&local_d28);
                  std::__cxx11::string::~string((string *)&local_d28);
                  std::__cxx11::string::~string((string *)(local_d62 + 2));
                  std::__cxx11::string::~string((string *)&local_d00);
                  std::allocator<char>::~allocator((allocator<char> *)&local_d01);
                  JoinerSession::Connect((JoinerSession *)peerAddr.field_2._8_8_);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_d88,"joiner-session",&local_d89);
                  HandleRlyRx::anon_class_1_0_00000001::operator()(&local_dc2);
                  local_338 = &local_dc0;
                  local_340 = &local_dc1;
                  bVar14 = ::fmt::v10::operator()(local_340);
                  local_db8 = (char *)bVar14.size_;
                  local_dc0 = (v10 *)bVar14.data_;
                  ::fmt::v10::detail::
                  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                            ();
                  this_00 = (commissioner *)
                            JoinerSession::GetExpirationTime
                                      ((JoinerSession *)peerAddr.field_2._8_8_);
                  TimePointToString_abi_cxx11_(&local_de8,this_00,aTimePoint);
                  local_570 = &local_db0;
                  local_580 = local_dc0;
                  pcStack_578 = local_db8;
                  local_588 = &local_de8;
                  local_e0 = &local_580;
                  local_598 = local_dc0;
                  local_590 = local_db8;
                  local_d8 = local_598;
                  pcStack_d0 = local_590;
                  local_5b8[0] = ::fmt::v10::
                                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                           ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)local_588,(v10 *)this_00,local_570);
                  local_188 = local_5a8;
                  local_190 = local_5b8;
                  local_178 = 0xd;
                  fmt_07.size_ = 0xd;
                  fmt_07.data_ = local_590;
                  args_07.field_1.values_ = in_R9.values_;
                  args_07.desc_ = (unsigned_long_long)local_190;
                  local_180 = local_190;
                  local_170 = local_188;
                  local_138 = local_190;
                  ::fmt::v10::vformat_abi_cxx11_(&local_db0,local_598,fmt_07,args_07);
                  Log(kInfo,&local_d88,&local_db0);
                  std::__cxx11::string::~string((string *)&local_db0);
                  std::__cxx11::string::~string((string *)&local_de8);
                  std::__cxx11::string::~string((string *)&local_d88);
                  std::allocator<char>::~allocator((allocator<char> *)&local_d89);
                  pTVar11 = JoinerSession::GetExpirationTime
                                      ((JoinerSession *)peerAddr.field_2._8_8_);
                  TStack_df0.__d.__r = (duration)(pTVar11->__d).__r;
                  Timer::Start(&this->mJoinerSessionTimer,TStack_df0);
                  std::__cxx11::string::~string((string *)local_cc8);
                  local_df4 = 0;
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_b00,"joiner-session",&local_b01);
                HandleRlyRx::anon_class_1_0_00000001::operator()(&local_b3a);
                local_3f0 = &local_b38;
                local_3f8 = &local_b39;
                bVar14 = ::fmt::v10::operator()(local_3f8);
                local_b30 = (char *)bVar14.size_;
                local_b38 = (v10 *)bVar14.data_;
                ::fmt::v10::detail::
                check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                          ();
                pvVar13 = (v10 *)&dtlsRecords.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                utils::Hex_abi_cxx11_(&local_b60,(utils *)pvVar13,aBytes_00);
                local_4d0 = &local_b28;
                local_4e0 = local_b38;
                pcStack_4d8 = local_b30;
                local_4e8 = &local_b60;
                local_120 = &local_4e0;
                local_4f8 = local_b38;
                local_4f0 = local_b30;
                local_118 = local_4f8;
                pcStack_110 = local_4f0;
                local_518[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                         ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)local_4e8,pvVar13,local_4d0);
                local_1d8 = local_508;
                local_1e0 = local_518;
                local_1c8 = 0xd;
                fmt_04.size_ = 0xd;
                fmt_04.data_ = local_4f0;
                args_04.field_1.values_ = in_R9.values_;
                args_04.desc_ = (unsigned_long_long)local_1e0;
                local_1d0 = local_1e0;
                local_1c0 = local_1d8;
                local_128 = local_1e0;
                ::fmt::v10::vformat_abi_cxx11_(&local_b28,local_4f8,fmt_04,args_04);
                Log(kInfo,&local_b00,&local_b28);
                std::__cxx11::string::~string((string *)&local_b28);
                std::__cxx11::string::~string((string *)&local_b60);
                std::__cxx11::string::~string((string *)&local_b00);
                std::allocator<char>::~allocator((allocator<char> *)&local_b01);
                HandleRlyRx::anon_class_1_0_00000001::operator()(&local_bba);
                local_3e0 = &local_bb8;
                local_3e8 = &local_bb9;
                bVar14 = ::fmt::v10::operator()(local_3e8);
                local_bb0 = (char *)bVar14.size_;
                local_bb8 = (v10 *)bVar14.data_;
                ::fmt::v10::detail::
                check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                          ();
                pvVar13 = (v10 *)&dtlsRecords.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                utils::Hex_abi_cxx11_(&local_be0,(utils *)pvVar13,aBytes_01);
                local_520 = &local_ba8;
                local_530 = local_bb8;
                pcStack_528 = local_bb0;
                local_538 = &local_be0;
                local_100 = &local_530;
                local_548 = local_bb8;
                local_540 = local_bb0;
                local_f8 = local_548;
                pcStack_f0 = local_540;
                local_568[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                         ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)local_538,pvVar13,local_520);
                local_1b0 = local_558;
                local_1b8 = local_568;
                local_1a0 = 0xd;
                fmt_05.size_ = 0xd;
                fmt_05.data_ = local_540;
                args_05.field_1.values_ = in_R9.values_;
                args_05.desc_ = (unsigned_long_long)local_1b8;
                local_1a8 = local_1b8;
                local_198 = local_1b0;
                local_130 = local_1b8;
                ::fmt::v10::vformat_abi_cxx11_(&local_ba8,local_548,fmt_05,args_05);
                Error::Error(&local_b88,kRejected,&local_ba8);
                Error::operator=((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 &local_b88);
                Error::~Error(&local_b88);
                std::__cxx11::string::~string((string *)&local_ba8);
                std::__cxx11::string::~string((string *)&local_be0);
                local_df4 = 4;
              }
              Address::~Address((Address *)local_ac0);
              if (local_df4 != 0) goto LAB_0028390a;
            }
            session = (JoinerSession *)
                      std::
                      map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
                      ::end(&this->mJoinerSessions);
            local_df5 = std::operator!=(&local_a80,(_Self *)&session);
            if (!(bool)local_df5) {
              __assert_fail("condition",
                            "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp"
                            ,0xa34,
                            "void ot::commissioner::CommissionerImpl::HandleRlyRx(const coap::Request &)"
                           );
            }
            ppVar12 = std::
                      _Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>
                      ::operator->(&local_a80);
            local_e08 = &ppVar12->second;
            JoinerSession::RecvJoinerDtlsRecords(local_e08,(ByteArray *)local_830);
          }
          else {
            HandleRlyRx::anon_class_1_0_00000001::operator()(&local_9ea);
            local_490 = &local_9e8;
            local_498 = &local_9e9;
            bVar14 = ::fmt::v10::operator()(local_498);
            local_9e0 = bVar14.size_;
            local_9e8 = (v10 *)bVar14.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_700 = &local_9d8;
            local_710 = local_9e8;
            sStack_708 = local_9e0;
            local_2c0 = &local_710;
            local_720 = local_9e8;
            local_718 = local_9e0;
            local_2b8 = local_720;
            sStack_2b0 = local_718;
            this_local = (CommissionerImpl *)
                         ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
            ;
            local_220 = local_730;
            local_228 = &this_local;
            local_210 = 0;
            fmt_02.size_ = 0;
            fmt_02.data_ = (char *)local_718;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)local_228;
            local_218 = local_228;
            local_208 = local_220;
            local_200 = local_228;
            ::fmt::v10::vformat_abi_cxx11_(&local_9d8,local_720,fmt_02,args_02);
            Error::Error(&local_9b8,kBadFormat,&local_9d8);
            Error::operator=((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &local_9b8);
            Error::~Error(&local_9b8);
            std::__cxx11::string::~string((string *)&local_9d8);
          }
        }
        else {
          HandleRlyRx::anon_class_1_0_00000001::operator()(&local_98a);
          local_4a0 = &local_988;
          local_4a8 = &local_989;
          bVar14 = ::fmt::v10::operator()(local_4a8);
          local_980 = bVar14.size_;
          local_988 = (v10 *)bVar14.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_6b0 = &local_978;
          local_6c0 = local_988;
          sStack_6b8 = local_980;
          local_2e0 = &local_6c0;
          local_6d0 = local_988;
          local_6c8 = local_980;
          local_2d8 = local_6d0;
          sStack_2d0 = local_6c8;
          local_6f8[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_248 = local_6e0;
          local_250 = local_6f8;
          local_238 = 0;
          fmt_01.size_ = 0;
          fmt_01.data_ = (char *)local_6c8;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_250;
          local_240 = local_250;
          local_230 = local_248;
          local_1f8 = local_250;
          ::fmt::v10::vformat_abi_cxx11_(&local_978,local_6d0,fmt_01,args_01);
          Error::Error(&local_958,kBadFormat,&local_978);
          Error::operator=((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_958);
          Error::~Error(&local_958);
          std::__cxx11::string::~string((string *)&local_978);
        }
      }
      else {
        HandleRlyRx::anon_class_1_0_00000001::operator()(&local_92a);
        local_4b0 = &local_928;
        local_4b8 = &local_929;
        bVar14 = ::fmt::v10::operator()(local_4b8);
        local_920 = bVar14.size_;
        local_928 = (v10 *)bVar14.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_660 = &local_918;
        local_670 = local_928;
        sStack_668 = local_920;
        local_300 = &local_670;
        local_680 = local_928;
        local_678 = local_920;
        local_2f8 = local_680;
        sStack_2f0 = local_678;
        local_6a8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_270 = local_690;
        local_278 = local_6a8;
        local_260 = 0;
        fmt_00.size_ = 0;
        fmt_00.data_ = (char *)local_678;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_278;
        local_268 = local_278;
        local_258 = local_270;
        local_1f0 = local_278;
        ::fmt::v10::vformat_abi_cxx11_(&local_918,local_680,fmt_00,args_00);
        Error::Error(&local_8f8,kBadFormat,&local_918);
        Error::operator=((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         &local_8f8);
        Error::~Error(&local_8f8);
        std::__cxx11::string::~string((string *)&local_918);
      }
    }
    else {
      HandleRlyRx::anon_class_1_0_00000001::operator()(&local_8ca);
      local_4c0 = &local_8c8;
      local_4c8 = &local_8c9;
      bVar14 = ::fmt::v10::operator()(local_4c8);
      local_8c0 = bVar14.size_;
      local_8c8 = (v10 *)bVar14.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_610 = &local_8b8;
      local_620 = local_8c8;
      sStack_618 = local_8c0;
      local_320 = &local_620;
      local_630 = local_8c8;
      local_628 = local_8c0;
      local_318 = local_630;
      sStack_310 = local_628;
      local_658[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_298 = local_640;
      local_2a0 = local_658;
      local_288 = 0;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_628;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_2a0;
      local_290 = local_2a0;
      local_280 = local_298;
      local_1e8 = local_2a0;
      ::fmt::v10::vformat_abi_cxx11_(&local_8b8,local_630,fmt,args);
      Error::Error(&local_898,kBadFormat,&local_8b8);
      Error::operator=((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_898)
      ;
      Error::~Error(&local_898);
      std::__cxx11::string::~string((string *)&local_8b8);
    }
  }
LAB_0028390a:
  local_e0c = kNone;
  bVar1 = commissioner::operator!=
                    ((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_e0c);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e30,"joiner-session",&local_e31);
    HandleRlyRx::anon_class_1_0_00000001::operator()(&local_e6a);
    local_328 = &local_e68;
    local_330 = &local_e69;
    bVar14 = ::fmt::v10::operator()(local_330);
    local_e60 = (char *)bVar14.size_;
    local_e68 = (v10 *)bVar14.data_;
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
              ();
    pvVar13 = (v10 *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count;
    Error::ToString_abi_cxx11_(&local_e90,(Error *)pvVar13);
    local_5c0 = &local_e58;
    local_5d0 = local_e68;
    pcStack_5c8 = local_e60;
    local_5d8 = &local_e90;
    local_c0 = &local_5d0;
    local_5e8 = local_e68;
    local_5e0 = local_e60;
    local_b8 = local_5e8;
    pcStack_b0 = local_5e0;
    local_608[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_5d8,pvVar13,local_5c0);
    local_160 = local_5f8;
    local_168 = local_608;
    local_150 = 0xd;
    fmt_08.size_ = 0xd;
    fmt_08.data_ = local_5e0;
    args_08.field_1.values_ = in_R9.values_;
    args_08.desc_ = (unsigned_long_long)local_168;
    local_158 = local_168;
    local_148 = local_160;
    local_140 = local_168;
    ::fmt::v10::vformat_abi_cxx11_(&local_e58,local_5e8,fmt_08,args_08);
    Log(kError,&local_e30,&local_e58);
    std::__cxx11::string::~string((string *)&local_e58);
    std::__cxx11::string::~string((string *)&local_e90);
    std::__cxx11::string::~string((string *)&local_e30);
    std::allocator<char>::~allocator((allocator<char> *)&local_e31);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_830);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &dtlsRecords.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_7e0);
  std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
            ((shared_ptr<ot::commissioner::tlv::Tlv> *)((long)&joinerPSKd.field_2 + 8));
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
          *)&tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount);
  Error::~Error((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void CommissionerImpl::HandleRlyRx(const coap::Request &aRlyRx)
{
    Error       error;
    tlv::TlvSet tlvSet;
    tlv::TlvPtr tlv;

    std::string joinerPSKd;
    uint16_t    joinerUdpPort;
    uint16_t    joinerRouterLocator;
    ByteArray   joinerIid;
    ByteArray   joinerId;
    ByteArray   dtlsRecords;

    SuccessOrExit(error = GetTlvSet(tlvSet, aRlyRx));

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerUdpPort]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner UDP Port TLV found"));
    joinerUdpPort = tlv->GetValueAsUint16();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerRouterLocator]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner Router Locator TLV found"));
    joinerRouterLocator = tlv->GetValueAsUint16();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerIID]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner IID TLV found"));
    joinerIid = tlv->GetValue();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerDtlsEncapsulation]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner DTLS Encapsulation TLV found"));
    dtlsRecords = tlv->GetValue();

    joinerId = joinerIid;
    joinerId[0] ^= kLocalExternalAddrMask;
    LOG_DEBUG(LOG_REGION_JOINER_SESSION, "received RLY_RX.ntf: joinerID={}, joinerRouterLocator={}, length={}",
              utils::Hex(joinerId), joinerRouterLocator, dtlsRecords.size());

    {
        auto it = mJoinerSessions.find(joinerId);
        if (it != mJoinerSessions.end() && it->second.Disabled())
        {
            mJoinerSessions.erase(it);
            it = mJoinerSessions.end();
        }

        if (it == mJoinerSessions.end())
        {
            Address localAddr;

            joinerPSKd = mCommissionerHandler.OnJoinerRequest(joinerId);
            if (joinerPSKd.empty())
            {
                LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner(ID={}) is disabled", utils::Hex(joinerId));
                ExitNow(error = ERROR_REJECTED("joiner(ID={}) is disabled", utils::Hex(joinerId)));
            }

            SuccessOrExit(error = mBrClient.GetLocalAddr(localAddr));
            it = mJoinerSessions
                     .emplace(std::piecewise_construct, std::forward_as_tuple(joinerId),
                              std::forward_as_tuple(*this, joinerId, joinerPSKd, joinerUdpPort, joinerRouterLocator,
                                                    aRlyRx.GetEndpoint()->GetPeerAddr(),
                                                    aRlyRx.GetEndpoint()->GetPeerPort(), localAddr,
                                                    kListeningJoinerPort))
                     .first;
            auto &session = it->second;

            std::string peerAddr = session.GetPeerAddr().ToString();

            LOG_DEBUG(LOG_REGION_JOINER_SESSION, "received a new joiner(ID={}) DTLS connection from [{}]:{}",
                      utils::Hex(joinerId), peerAddr, session.GetPeerPort());

            session.Connect();

            LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner session timer started, expiration-time={}",
                     TimePointToString(session.GetExpirationTime()));
            mJoinerSessionTimer.Start(session.GetExpirationTime());
        }

        ASSERT(it != mJoinerSessions.end());
        auto &session = it->second;
        session.RecvJoinerDtlsRecords(dtlsRecords);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_ERROR(LOG_REGION_JOINER_SESSION, "failed to handle RLY_RX.ntf message: {}", error.ToString());
    }
}